

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPropertyDefinition.cxx
# Opt level: O2

cmPropertyDefinition * __thiscall
cmPropertyDefinitionMap::GetPropertyDefinition
          (cmPropertyDefinitionMap *this,string *name,ScopeType scope)

{
  const_iterator cVar1;
  cmPropertyDefinition *pcVar2;
  key_type local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  local_40.second = scope;
  cVar1 = std::
          _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
          ::find((_Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
                  *)this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pcVar2 = (cmPropertyDefinition *)0x0;
  if ((_Rb_tree_header *)cVar1._M_node != &(this->Map_)._M_t._M_impl.super__Rb_tree_header) {
    pcVar2 = (cmPropertyDefinition *)&cVar1._M_node[2]._M_parent;
  }
  return pcVar2;
}

Assistant:

cmPropertyDefinition const* cmPropertyDefinitionMap::GetPropertyDefinition(
  const std::string& name, cmProperty::ScopeType scope) const
{
  auto it = this->Map_.find(KeyType(name, scope));
  if (it != this->Map_.end()) {
    return &it->second;
  }

  return nullptr;
}